

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O1

_Bool ts_parser__better_version_exists
                (TSParser *self,StackVersion version,_Bool is_in_error,uint cost)

{
  SubtreeHeapData *pSVar1;
  Stack *self_00;
  _Bool _Var2;
  uint uVar3;
  ErrorComparison EVar4;
  undefined8 uVar5;
  uint uVar6;
  undefined7 in_register_00000011;
  StackVersion version_00;
  ulong uVar7;
  undefined8 in_R8;
  long lVar8;
  Length LVar9;
  Length LVar10;
  ErrorStatus EVar11;
  ErrorStatus b;
  ErrorStatus a;
  uint local_38;
  
  pSVar1 = (self->finished_tree).ptr;
  if (pSVar1 != (SubtreeHeapData *)0x0) {
    if (((ulong)pSVar1 & 1) == 0) {
      uVar6 = *(uint *)&pSVar1->field_0x2c >> 7;
    }
    else {
      uVar6 = (uint)((ulong)pSVar1 >> 5) & 0x7ffffff;
    }
    uVar3 = 0x262;
    if ((uVar6 & 1) == 0) {
      uVar3 = 0;
    }
    if ((char)(uVar6 & 1) == '\0' && ((ulong)pSVar1 & 1) == 0) {
      uVar3 = pSVar1->error_cost;
    }
    if (uVar3 <= (uint)CONCAT71(in_register_00000011,is_in_error)) {
      return true;
    }
  }
  LVar9 = ts_stack_position(self->stack,version);
  uVar3 = ts_stack_node_count_since_error(self->stack,version);
  uVar6 = (self->stack->heads).size;
  if (uVar6 <= version) {
    __assert_fail("(uint32_t)version < (&self->heads)->size",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Aerijo[P]latex-language-server/third_party/tree-sitter/src/runtime/stack.c"
                  ,0x244,"int ts_stack_dynamic_precedence(Stack *, StackVersion)");
  }
  a.node_count = 0;
  a.cost = ((self->stack->heads).contents[version].node)->dynamic_precedence;
  lVar8 = 0x20;
  uVar7 = 0;
  do {
    if (version != uVar7) {
      self_00 = self->stack;
      if ((self_00->heads).size <= uVar7) {
        __assert_fail("(uint32_t)version < (&self->heads)->size",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Aerijo[P]latex-language-server/third_party/tree-sitter/src/runtime/stack.c"
                      ,0x2a8,"_Bool ts_stack_is_active(const Stack *, StackVersion)");
      }
      if (*(int *)((long)&((self_00->heads).contents)->node + lVar8) == 0) {
        version_00 = (StackVersion)uVar7;
        LVar10 = ts_stack_position(self_00,version_00);
        local_38 = LVar9.bytes;
        if (local_38 <= LVar10.bytes) {
          EVar11 = ts_parser__version_status(self,version_00);
          uVar5 = EVar11._0_8_;
          b.dynamic_precedence = (int)in_R8;
          b.is_in_error = (_Bool)(char)((ulong)in_R8 >> 0x20);
          b._13_3_ = (int3)((ulong)in_R8 >> 0x28);
          b.cost = (int)EVar11._8_8_;
          b.node_count = (int)((ulong)EVar11._8_8_ >> 0x20);
          a.dynamic_precedence = (int)uVar5;
          a.is_in_error = (_Bool)(char)((ulong)uVar5 >> 0x20);
          a._13_3_ = (int3)((ulong)uVar5 >> 0x28);
          EVar4 = ts_parser__compare_versions
                            ((TSParser *)
                             ((ulong)uVar3 << 0x20 |
                             CONCAT71(in_register_00000011,is_in_error) & 0xffffffff),a,b);
          if (EVar4 == ErrorComparisonPreferRight) {
            _Var2 = ts_stack_can_merge(self->stack,version_00,version);
            if (_Var2) {
              return true;
            }
          }
          else if (EVar4 == ErrorComparisonTakeRight) {
            return true;
          }
        }
      }
    }
    uVar7 = uVar7 + 1;
    lVar8 = lVar8 + 0x28;
  } while (uVar6 != uVar7);
  return uVar7 < uVar6;
}

Assistant:

static bool ts_parser__better_version_exists(TSParser *self, StackVersion version,
                                             bool is_in_error, unsigned cost) {
  if (self->finished_tree.ptr && ts_subtree_error_cost(self->finished_tree) <= cost) {
    return true;
  }

  Length position = ts_stack_position(self->stack, version);
  ErrorStatus status = {
    .cost = cost,
    .is_in_error = is_in_error,
    .dynamic_precedence = ts_stack_dynamic_precedence(self->stack, version),
    .node_count = ts_stack_node_count_since_error(self->stack, version),
  };

  for (StackVersion i = 0, n = ts_stack_version_count(self->stack); i < n; i++) {
    if (i == version ||
        !ts_stack_is_active(self->stack, i) ||
        ts_stack_position(self->stack, i).bytes < position.bytes) continue;
    ErrorStatus status_i = ts_parser__version_status(self, i);
    switch (ts_parser__compare_versions(self, status, status_i)) {
      case ErrorComparisonTakeRight:
        return true;
      case ErrorComparisonPreferRight:
        if (ts_stack_can_merge(self->stack, i, version)) return true;
      default:
        break;
    }
  }

  return false;
}